

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

RTMatrix4x4 * __thiscall
RTMatrix4x4::inverted(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this)

{
  int row_00;
  int col_00;
  RTFLOAT (*paRVar1) [4];
  int col;
  long lVar2;
  RTFLOAT (*paRVar3) [4];
  int row;
  long lVar4;
  RTFLOAT RVar5;
  float fVar6;
  RTFLOAT RVar7;
  
  RTMatrix4x4(__return_storage_ptr__);
  RVar5 = matDet(this);
  if ((RVar5 != 0.0) || (NAN(RVar5))) {
    lVar4 = 0;
    paRVar3 = (RTFLOAT (*) [4])__return_storage_ptr__;
    do {
      lVar2 = 0;
      paRVar1 = paRVar3;
      do {
        row_00 = (int)lVar4;
        col_00 = (int)lVar2;
        if ((row_00 + col_00 & 1U) == 0) {
          fVar6 = matMinor(this,row_00,col_00);
        }
        else {
          RVar7 = matMinor(this,row_00,col_00);
          fVar6 = -RVar7;
        }
        (*(RTFLOAT (*) [4])*paRVar1)[0] = fVar6 / RVar5;
        lVar2 = lVar2 + 1;
        paRVar1 = paRVar1 + 1;
      } while (lVar2 != 4);
      lVar4 = lVar4 + 1;
      paRVar3 = (RTFLOAT (*) [4])(*paRVar3 + 1);
    } while (lVar4 != 4);
  }
  else {
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 1) + 4) = 0.0;
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 1) + 8) = 0.0;
    *(undefined8 *)(__return_storage_ptr__->m_data[1] + 3) = 0;
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 2) + 4) = 0.0;
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 2) + 8) = 0.0;
    *(undefined8 *)(__return_storage_ptr__->m_data[2] + 3) = 0;
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 0) + 4) = 0.0;
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 0) + 8) = 0.0;
    *(undefined8 *)(__return_storage_ptr__->m_data[0] + 3) = 0;
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 3) + 4) = 0.0;
    *(RTFLOAT *)((long)(__return_storage_ptr__->m_data + 3) + 8) = 0.0;
    __return_storage_ptr__->m_data[0][0] = 1.0;
    __return_storage_ptr__->m_data[1][1] = 1.0;
    __return_storage_ptr__->m_data[2][2] = 1.0;
    __return_storage_ptr__->m_data[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

RTMatrix4x4 RTMatrix4x4::inverted()
{
    RTMatrix4x4 res;

    RTFLOAT det = matDet();

    if (det == 0) {
        res.setToIdentity();
        return res;
    }

    for (int row = 0; row < 4; row++) {
        for (int col = 0; col < 4; col++) {
            if ((row + col) & 1)
                res.m_data[col][row] = -matMinor(row, col) / det;
            else
                res.m_data[col][row] = matMinor(row, col) / det;
        }
    }

    return res;
}